

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpSolver.cc
# Opt level: O3

bool __thiscall Glucose::SimpSolver::implied(SimpSolver *this,vec<Glucose::Lit> *c)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  CRef CVar4;
  byte bVar5;
  long lVar6;
  bool bVar7;
  int local_24;
  
  vec<int>::push(&(this->super_Solver).trail_lim,&local_24);
  iVar3 = c->sz;
  if (0 < iVar3) {
    lVar6 = 0;
    do {
      uVar2 = c->data[lVar6].x;
      bVar1 = (this->super_Solver).assigns.data[(int)uVar2 >> 1].value;
      bVar5 = (byte)uVar2 & 1;
      if (bVar1 == bVar5) {
        bVar7 = false;
        goto LAB_00118005;
      }
      if ((bVar1 ^ bVar5) != 1) {
        Solver::uncheckedEnqueue(&this->super_Solver,(Lit)(uVar2 ^ 1),0xffffffff);
        iVar3 = c->sz;
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < iVar3);
  }
  CVar4 = Solver::propagate(&this->super_Solver);
  bVar7 = CVar4 != 0xffffffff;
LAB_00118005:
  Solver::cancelUntil(&this->super_Solver,0);
  return bVar7;
}

Assistant:

bool SimpSolver::implied(const vec<Lit>& c)
{
    assert(decisionLevel() == 0);

    trail_lim.push(trail.size());
    for (int i = 0; i < c.size(); i++)
        if (value(c[i]) == l_True){
            cancelUntil(0);
            return false;
        }else if (value(c[i]) != l_False){
            assert(value(c[i]) == l_Undef);
            uncheckedEnqueue(~c[i]);
        }

    bool result = propagate() != CRef_Undef;
    cancelUntil(0);
    return result;
}